

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O1

bool __thiscall POSG::SetInitialized(POSG *this,bool b)

{
  E *this_00;
  undefined7 in_register_00000031;
  
  if (this->_m_nrAgents != 0) {
    this->_m_initialized = true;
    return true;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28,CONCAT71(in_register_00000031,b));
  E::E(this_00,
       "POSG::SetInitialized failed because POSG doesn\'t know the number of agents yet. (use SetNrAgents first!)"
      );
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

bool POSG::SetInitialized(bool b)
{
    if(_m_nrAgents == 0)
    {
        throw E("POSG::SetInitialized failed because POSG doesn't know the \
number of agents yet. (use SetNrAgents first!)");
    }

    //do some checks?
    _m_initialized = true;
    return(true);
}